

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bels.c
# Opt level: O0

err_t belsGenM0(octet *m0,size_t len,gen_i ang,void *ang_state)

{
  bool_t bVar1;
  ulong uVar2;
  void *src;
  blob_t stack_00;
  u64 *dest;
  undefined8 in_RCX;
  word *a;
  code *in_RDX;
  size_t in_RSI;
  void *in_RDI;
  void *stack;
  word *f0;
  void *state;
  size_t reps;
  size_t n;
  blob_t n_00;
  word *pwVar3;
  err_t local_4;
  
  if (in_RDX == (code *)0x0) {
    local_4 = 0x131;
  }
  else if ((((in_RSI == 0x10) || (in_RSI == 0x18)) || (in_RSI == 0x20)) &&
          (bVar1 = memIsValid(in_RDI,in_RSI), bVar1 != 0)) {
    uVar2 = in_RSI + 7 >> 3;
    src = (void *)(uVar2 + 1);
    ppIsIrred_deep(uVar2 + 1);
    stack_00 = blobCreate((size_t)src);
    if (stack_00 == (blob_t)0x0) {
      local_4 = 0x6e;
    }
    else {
      dest = (u64 *)((long)stack_00 + uVar2 * 8 + 8);
      *(undefined8 *)((long)stack_00 + uVar2 * 8) = 1;
      n_00 = stack_00;
      pwVar3 = (word *)(in_RSI * 0x600 >> 2);
      do {
        a = (word *)((long)pwVar3 - 1);
        if (pwVar3 == (word *)0x0) goto LAB_00131a53;
        (*in_RDX)(stack_00,in_RSI,in_RCX);
        u64From(dest,src,0x131a1e);
        bVar1 = ppIsIrred(a,(size_t)n_00,stack_00);
        pwVar3 = a;
      } while (bVar1 == 0);
      u64To(dest,(size_t)src,(u64 *)0x131a4f);
LAB_00131a53:
      blobClose((blob_t)0x131a5d);
      local_4 = 0x131;
      if (a != (word *)0xffffffffffffffff) {
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = 0x6d;
  }
  return local_4;
}

Assistant:

err_t belsGenM0(octet m0[], size_t len, gen_i ang, void* ang_state)
{
	size_t n, reps;
	void* state;
	word* f0;
	void* stack;
	// проверить генератор
	if (ang == 0)
		return ERR_BAD_ANG;
	// проверить входные данные
	if ((len != 16 && len != 24 && len != 32) || 
		!memIsValid(m0, len))
		return ERR_BAD_INPUT;
	// создать состояние
	n = W_OF_O(len);
	state = blobCreate(n + 1 + ppIsIrred_deep(n + 1));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	f0 = (word*)state;
	stack = f0 + n + 1;
	// сгенерировать многочлен
	f0[n] = 1;
	for (reps = len * 8 * B_PER_IMPOSSIBLE * 3 / 4; reps--;)
	{
		ang(f0, len, ang_state);
		wwFrom(f0, f0, len);
		if (ppIsIrred(f0, n + 1, stack))
		{
			wwTo(m0, len, f0);
			break;
		}
	}
	// завершение
	blobClose(state);
	return reps != SIZE_MAX ? ERR_OK : ERR_BAD_ANG;
}